

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexity.cc
# Opt level: O1

vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_> *
benchmark::ComputeStats
          (vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
           *__return_storage_ptr__,
          vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          *reports)

{
  pointer pRVar1;
  size_t sVar2;
  long lVar3;
  _Alloc_hider _Var4;
  size_t __n;
  int iVar5;
  long lVar6;
  pointer pRVar7;
  pointer pRVar8;
  size_type *psVar9;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar17 [16];
  double dVar24;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar16;
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  Run stddev_data;
  undefined1 local_268 [32];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  CheckHandler local_1f8;
  CheckHandler local_1f0;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [24];
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [32];
  _Alloc_hider local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  bool local_160;
  _Alloc_hider local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  int64_t local_138;
  TimeUnit local_130;
  undefined1 local_128 [16];
  double local_118;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined1 auStack_108 [12];
  int local_f0;
  undefined2 local_ec;
  undefined1 local_e8 [32];
  _Alloc_hider local_c8;
  char *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  bool local_a8;
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  int64_t local_80;
  TimeUnit local_78;
  undefined1 local_70 [16];
  undefined1 local_60 [12];
  undefined4 uStack_54;
  undefined1 auStack_50 [12];
  int local_38;
  undefined2 local_34;
  
  (__return_storage_ptr__->
  super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pRVar1 = (reports->
           super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = 0;
  pRVar8 = (reports->
           super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
           )._M_impl.super__Vector_impl_data._M_start;
  for (pRVar7 = pRVar8; pRVar7 != pRVar1; pRVar7 = pRVar7 + 1) {
    lVar6 = lVar6 + (ulong)pRVar7->error_occurred;
  }
  if (1 < (ulong)(((long)pRVar1 - (long)pRVar8 >> 3) * -0x2c8590b21642c859 - lVar6)) {
    lVar6 = pRVar8->iterations;
    if (pRVar8 == pRVar1) {
      local_248 = (undefined1  [16])0x0;
      local_268._0_16_ = (undefined1  [16])0x0;
      local_208 = (undefined1  [16])0x0;
      local_238 = (undefined1  [16])0x0;
      local_218 = (undefined1  [16])0x0;
      local_228 = (undefined1  [16])0x0;
    }
    else {
      local_248 = (undefined1  [16])0x0;
      local_268._0_16_ = (undefined1  [16])0x0;
      local_208 = (undefined1  [16])0x0;
      local_238 = (undefined1  [16])0x0;
      local_218 = (undefined1  [16])0x0;
      local_228 = (undefined1  [16])0x0;
      do {
        pRVar7 = (reports->
                 super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        sVar2 = (pRVar7->benchmark_name)._M_string_length;
        if (sVar2 == (pRVar8->benchmark_name)._M_string_length) {
          if (sVar2 == 0) {
            bVar11 = true;
          }
          else {
            iVar5 = bcmp((pRVar7->benchmark_name)._M_dataplus._M_p,
                         (pRVar8->benchmark_name)._M_dataplus._M_p,sVar2);
            bVar11 = iVar5 == 0;
          }
        }
        else {
          bVar11 = false;
        }
        if (!bVar11) {
          internal::CheckHandler::CheckHandler
                    (&local_1f0,"(reports[0].benchmark_name) == (run.benchmark_name)",
                     "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/complexity.cc"
                     ,"ComputeStats",0xb2);
          internal::CheckHandler::~CheckHandler(&local_1f0);
        }
        internal::GetNullLogInstance();
        if (lVar6 != pRVar8->iterations) {
          internal::CheckHandler::CheckHandler
                    (&local_1f8,"(run_iterations) == (run.iterations)",
                     "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/complexity.cc"
                     ,"ComputeStats",0xb3);
          internal::CheckHandler::~CheckHandler(&local_1f8);
        }
        internal::GetNullLogInstance();
        if (pRVar8->error_occurred == false) {
          lVar3 = pRVar8->iterations;
          auVar13._0_8_ = (double)lVar3;
          auVar17._0_8_ = pRVar8->real_accumulated_time;
          auVar17._8_8_ = pRVar8->cpu_accumulated_time;
          auVar13._8_8_ = auVar13._0_8_;
          auVar17 = divpd(auVar17,auVar13);
          dVar16 = auVar17._0_8_;
          dVar24 = auVar17._8_8_;
          local_268._8_8_ = (double)local_268._8_8_ + dVar24 * auVar13._0_8_;
          local_268._0_8_ = (double)local_268._0_8_ + dVar16 * auVar13._0_8_;
          auVar25._8_4_ = (int)lVar3;
          auVar25._0_8_ = lVar3;
          auVar25._12_4_ = (int)((ulong)lVar3 >> 0x20);
          local_248._8_8_ = local_248._8_8_ + auVar25._8_8_;
          local_248._0_8_ = local_248._0_8_ + lVar3;
          dVar15 = pRVar8->bytes_per_second;
          dVar12 = pRVar8->items_per_second;
          local_238._8_8_ = (double)local_238._8_8_ + dVar12 * auVar13._0_8_;
          local_238._0_8_ = (double)local_238._0_8_ + dVar15 * auVar13._0_8_;
          local_218._8_8_ = (double)local_218._8_8_ + dVar12 * dVar12 * auVar13._0_8_;
          local_218._0_8_ = (double)local_218._0_8_ + dVar15 * dVar15 * auVar13._0_8_;
          local_228._8_8_ = (double)local_228._8_8_ + dVar24 * dVar24 * auVar13._0_8_;
          local_228._0_8_ = (double)local_228._0_8_ + dVar16 * dVar16 * auVar13._0_8_;
          local_208._8_8_ = local_208._8_8_ + auVar25._8_8_;
          local_208._0_8_ = local_208._0_8_ + lVar3;
        }
        pRVar8 = pRVar8 + 1;
      } while (pRVar8 != pRVar1);
    }
    local_e8._0_8_ = local_e8 + 0x10;
    local_e8._8_8_ = 0;
    local_e8[0x10] = '\0';
    local_c8._M_p = (pointer)&local_b8;
    local_c0 = (char *)0x0;
    local_b8._M_local_buf[0] = '\0';
    local_a8 = false;
    local_98 = 0;
    local_90._M_local_buf[0] = '\0';
    local_80 = 1;
    local_78 = kNanosecond;
    local_38 = 0;
    local_34._0_1_ = false;
    local_34._1_1_ = false;
    local_70 = (undefined1  [16])0x0;
    local_60 = SUB1612((undefined1  [16])0x0,0);
    uStack_54 = 0;
    auStack_50 = SUB1612((undefined1  [16])0x0,4);
    pRVar8 = (reports->
             super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
             )._M_impl.super__Vector_impl_data._M_start;
    _Var4._M_p = (pRVar8->benchmark_name)._M_dataplus._M_p;
    local_1a0._0_8_ = local_1a0 + 0x10;
    local_a0._M_p = (pointer)&local_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a0,_Var4._M_p,_Var4._M_p + (pRVar8->benchmark_name)._M_string_length
              );
    std::__cxx11::string::append(local_1a0);
    std::__cxx11::string::operator=((string *)local_e8,(string *)local_1a0);
    if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
      operator_delete((void *)local_1a0._0_8_);
    }
    auVar18._0_8_ = (double)local_248._0_8_;
    auVar18._8_8_ = (double)local_248._8_8_;
    local_1e8 = divpd(_DAT_001365f0,auVar18);
    local_268._0_8_ = (double)local_268._0_8_ * local_1e8._0_8_;
    local_268._8_8_ = (double)local_268._8_8_ * local_1e8._8_8_;
    auVar19._0_4_ = -(uint)(local_248._0_4_ == 0);
    auVar19._4_4_ = -(uint)(local_248._4_4_ == 0);
    auVar19._8_4_ = -(uint)(local_248._8_4_ == 0);
    auVar19._12_4_ = -(uint)(local_248._12_4_ == 0);
    auVar27._4_4_ = auVar19._0_4_;
    auVar27._0_4_ = auVar19._4_4_;
    auVar27._8_4_ = auVar19._12_4_;
    auVar27._12_4_ = auVar19._8_4_;
    auVar28._8_8_ = local_268._8_8_;
    auVar28._0_8_ = local_268._0_8_;
    auVar28 = ~(auVar27 & auVar19) & auVar28;
    local_70._8_8_ = (double)lVar6 * auVar28._8_8_;
    local_70._0_8_ = (double)lVar6 * auVar28._0_8_;
    auVar20._0_8_ = (double)local_208._0_8_;
    auVar20._8_8_ = (double)local_208._8_8_;
    local_1d8._0_16_ = divpd(_DAT_001365f0,auVar20);
    auVar26._0_8_ = (double)local_238._0_8_ * local_1d8._0_8_;
    auVar26._8_8_ = (double)local_238._8_8_ * local_1d8._8_8_;
    auVar14._0_4_ = -(uint)(local_208._0_4_ == 0);
    auVar14._4_4_ = -(uint)(local_208._4_4_ == 0);
    auVar14._8_4_ = -(uint)(local_208._8_4_ == 0);
    auVar14._12_4_ = -(uint)(local_208._12_4_ == 0);
    auVar21._4_4_ = auVar14._0_4_;
    auVar21._0_4_ = auVar14._4_4_;
    auVar21._8_4_ = auVar14._12_4_;
    auVar21._12_4_ = auVar14._8_4_;
    auVar17 = ~(auVar21 & auVar14) & auVar26;
    local_60 = auVar17._0_12_;
    uStack_54 = auVar17._12_4_;
    local_80 = lVar6;
    std::__cxx11::string::_M_assign((string *)&local_c8);
    pRVar8 = (reports->
             super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar10 = ((long)(reports->
                    super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar8 >> 3) *
             -0x2c8590b21642c859;
    if (1 < uVar10) {
      sVar2 = (pRVar8->report_label)._M_string_length;
      lVar6 = uVar10 - 1;
      psVar9 = &pRVar8[1].report_label._M_string_length;
      do {
        __n = *psVar9;
        if ((__n != sVar2) ||
           ((__n != 0 &&
            (iVar5 = bcmp((((string *)(psVar9 + -1))->_M_dataplus)._M_p,
                          (pRVar8->report_label)._M_dataplus._M_p,__n), iVar5 != 0)))) {
          std::__cxx11::string::_M_replace((ulong)&local_c8,0,local_c0,0x135eec);
          break;
        }
        psVar9 = psVar9 + 0x17;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
    local_1a0._0_8_ = local_1a0 + 0x10;
    local_1a0._8_8_ = 0;
    local_1a0[0x10] = '\0';
    local_178 = 0;
    local_170._M_local_buf[0] = '\0';
    local_160 = false;
    local_150 = 0;
    local_148._M_local_buf[0] = '\0';
    local_138 = 1;
    local_130 = kNanosecond;
    local_f0 = 0;
    local_ec._0_1_ = false;
    local_ec._1_1_ = false;
    local_128 = (undefined1  [16])0x0;
    local_118 = 0.0;
    uStack_110 = 0;
    uStack_10c = 0;
    auStack_108 = SUB1612((undefined1  [16])0x0,4);
    pRVar8 = (reports->
             super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
             )._M_impl.super__Vector_impl_data._M_start;
    _Var4._M_p = (pRVar8->benchmark_name)._M_dataplus._M_p;
    local_1c0[0] = local_1b0;
    local_180._M_p = (pointer)&local_170;
    local_158._M_p = (pointer)&local_148;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1c0,_Var4._M_p,_Var4._M_p + (pRVar8->benchmark_name)._M_string_length
              );
    std::__cxx11::string::append((char *)local_1c0);
    std::__cxx11::string::operator=((string *)local_1a0,(string *)local_1c0);
    if (local_1c0[0] != local_1b0) {
      operator_delete(local_1c0[0]);
    }
    std::__cxx11::string::_M_assign((string *)&local_180);
    auVar22._0_4_ = -(uint)(local_248._0_4_ == 0);
    auVar22._4_4_ = -(uint)(local_248._4_4_ == 0);
    auVar22._8_4_ = -(uint)(local_248._8_4_ == 0);
    auVar22._12_4_ = -(uint)(local_248._12_4_ == 0);
    auVar29._4_4_ = auVar22._0_4_;
    auVar29._0_4_ = auVar22._4_4_;
    auVar29._8_4_ = auVar22._12_4_;
    auVar29._12_4_ = auVar22._8_4_;
    local_138 = 0;
    dVar15 = 0.0;
    if ((auVar29 & auVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      dVar12 = (double)local_228._0_8_ * (double)local_1e8._0_8_ -
               (double)local_268._0_8_ * (double)local_268._0_8_;
      dVar15 = 0.0;
      if (0.0 <= dVar12) {
        if (dVar12 < 0.0) {
          dVar15 = sqrt(dVar12);
        }
        else {
          dVar15 = SQRT(dVar12);
        }
      }
    }
    dVar12 = 0.0;
    local_128._0_8_ = dVar15;
    if ((auVar29 & auVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      dVar16 = (double)local_228._8_8_ * (double)local_1e8._8_8_ -
               (double)local_268._8_8_ * (double)local_268._8_8_;
      if (0.0 <= dVar16) {
        if (dVar16 < 0.0) {
          dVar12 = sqrt(dVar16);
          dVar15 = (double)local_128._0_8_;
        }
        else {
          dVar12 = SQRT(dVar16);
        }
      }
    }
    local_128._0_8_ = dVar15;
    auVar23._0_4_ = -(uint)(local_208._0_4_ == 0);
    auVar23._4_4_ = -(uint)(local_208._4_4_ == 0);
    auVar23._8_4_ = -(uint)(local_208._8_4_ == 0);
    auVar23._12_4_ = -(uint)(local_208._12_4_ == 0);
    auVar30._4_4_ = auVar23._0_4_;
    auVar30._0_4_ = auVar23._4_4_;
    auVar30._8_4_ = auVar23._12_4_;
    auVar30._12_4_ = auVar23._8_4_;
    local_128._8_8_ = dVar12;
    dVar15 = 0.0;
    if ((auVar30 & auVar23 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      dVar12 = (double)local_218._0_8_ * (double)local_1d8._0_8_ - auVar26._0_8_ * auVar26._0_8_;
      dVar15 = 0.0;
      if (0.0 <= dVar12) {
        if (dVar12 < 0.0) {
          dVar15 = sqrt(dVar12);
        }
        else {
          dVar15 = SQRT(dVar12);
        }
      }
    }
    dVar12 = 0.0;
    local_118 = dVar15;
    if ((auVar30 & auVar23 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      dVar15 = (double)local_218._8_8_ * (double)local_1d8._8_8_ - auVar26._8_8_ * auVar26._8_8_;
      if (0.0 <= dVar15) {
        if (dVar15 < 0.0) {
          dVar12 = sqrt(dVar15);
        }
        else {
          dVar12 = SQRT(dVar15);
        }
      }
    }
    uStack_110 = SUB84(dVar12,0);
    uStack_10c = (undefined4)((ulong)dVar12 >> 0x20);
    std::
    vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>::
    push_back(__return_storage_ptr__,(value_type *)local_e8);
    std::
    vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>::
    push_back(__return_storage_ptr__,(value_type *)local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_p != &local_148) {
      operator_delete(local_158._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_p != &local_170) {
      operator_delete(local_180._M_p);
    }
    if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
      operator_delete((void *)local_1a0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_p != &local_90) {
      operator_delete(local_a0._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_p != &local_b8) {
      operator_delete(local_c8._M_p);
    }
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<BenchmarkReporter::Run> ComputeStats(
    const std::vector<BenchmarkReporter::Run>& reports) {
  typedef BenchmarkReporter::Run Run;
  std::vector<Run> results;

  auto error_count =
      std::count_if(reports.begin(), reports.end(),
                    [](Run const& run) { return run.error_occurred; });

  if (reports.size() - error_count < 2) {
    // We don't report aggregated data if there was a single run.
    return results;
  }
  // Accumulators.
  Stat1_d real_accumulated_time_stat;
  Stat1_d cpu_accumulated_time_stat;
  Stat1_d bytes_per_second_stat;
  Stat1_d items_per_second_stat;
  // All repetitions should be run with the same number of iterations so we
  // can take this information from the first benchmark.
  int64_t const run_iterations = reports.front().iterations;

  // Populate the accumulators.
  for (Run const& run : reports) {
    CHECK_EQ(reports[0].benchmark_name, run.benchmark_name);
    CHECK_EQ(run_iterations, run.iterations);
    if (run.error_occurred) continue;
    real_accumulated_time_stat +=
        Stat1_d(run.real_accumulated_time / run.iterations, run.iterations);
    cpu_accumulated_time_stat +=
        Stat1_d(run.cpu_accumulated_time / run.iterations, run.iterations);
    items_per_second_stat += Stat1_d(run.items_per_second, run.iterations);
    bytes_per_second_stat += Stat1_d(run.bytes_per_second, run.iterations);
  }

  // Get the data from the accumulator to BenchmarkReporter::Run's.
  Run mean_data;
  mean_data.benchmark_name = reports[0].benchmark_name + "_mean";
  mean_data.iterations = run_iterations;
  mean_data.real_accumulated_time =
      real_accumulated_time_stat.Mean() * run_iterations;
  mean_data.cpu_accumulated_time =
      cpu_accumulated_time_stat.Mean() * run_iterations;
  mean_data.bytes_per_second = bytes_per_second_stat.Mean();
  mean_data.items_per_second = items_per_second_stat.Mean();

  // Only add label to mean/stddev if it is same for all runs
  mean_data.report_label = reports[0].report_label;
  for (std::size_t i = 1; i < reports.size(); i++) {
    if (reports[i].report_label != reports[0].report_label) {
      mean_data.report_label = "";
      break;
    }
  }

  Run stddev_data;
  stddev_data.benchmark_name = reports[0].benchmark_name + "_stddev";
  stddev_data.report_label = mean_data.report_label;
  stddev_data.iterations = 0;
  stddev_data.real_accumulated_time = real_accumulated_time_stat.StdDev();
  stddev_data.cpu_accumulated_time = cpu_accumulated_time_stat.StdDev();
  stddev_data.bytes_per_second = bytes_per_second_stat.StdDev();
  stddev_data.items_per_second = items_per_second_stat.StdDev();

  results.push_back(mean_data);
  results.push_back(stddev_data);
  return results;
}